

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdAddPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key,char *value)

{
  bool bVar1;
  undefined8 uVar2;
  uint32_t in_ECX;
  CfdError in_EDX;
  long in_RSI;
  char *in_R8;
  CfdException *in_R9;
  CfdException *except;
  exception *std_except;
  ByteData data;
  ByteData key_data;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  string *in_stack_fffffffffffffd80;
  string *message;
  CfdError in_stack_fffffffffffffd8c;
  CfdException *in_stack_fffffffffffffd90;
  undefined1 local_1f1 [33];
  CfdSourceLocation local_1d0;
  allocator local_1b1;
  string local_1b0;
  string *in_stack_fffffffffffffe78;
  pointer in_stack_fffffffffffffe80;
  allocator local_171;
  string local_170;
  ByteData local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  CfdSourceLocation local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  CfdException *local_30;
  char *local_28;
  uint32_t local_20;
  CfdError local_1c;
  long local_18;
  int local_4;
  
  local_34 = 0xffffffff;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"PsbtHandle",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x8b8;
    local_90.funcname = "CfdAddPsbtRecord";
    cfd::core::logger::warn<>(&local_90,"key is null or empty.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. key is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (CfdException *)0x0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x8be;
    local_d0.funcname = "CfdAddPsbtRecord";
    cfd::core::logger::warn<>(&local_d0,"value is null.");
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to parameter. value is null.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    local_f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_78 + 0x18) == 0) {
    local_110.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_110.filename = local_110.filename + 1;
    local_110.line = 0x8c4;
    local_110.funcname = "CfdAddPsbtRecord";
    cfd::core::logger::warn<>(&local_110,"psbt is null.");
    local_132 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Failed to handle statement. psbt is null.",&local_131);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    local_132 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,local_28,&local_171);
  cfd::core::ByteData::ByteData(&local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,(char *)local_30,&local_1b1);
  cfd::core::ByteData::ByteData((ByteData *)&stack0xfffffffffffffe70,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  if (local_1c == kCfdIllegalArgumentError) {
    cfd::core::Psbt::SetGlobalRecord
              (*(Psbt **)(local_78 + 0x18),&local_150,(ByteData *)&stack0xfffffffffffffe70);
  }
  else if (local_1c == kCfdIllegalStateError) {
    cfd::core::Psbt::SetTxInRecord
              (*(Psbt **)(local_78 + 0x18),local_20,&local_150,(ByteData *)&stack0xfffffffffffffe70)
    ;
  }
  else {
    if (local_1c != kCfdOutOfRangeError) {
      local_1d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_1d0.filename = local_1d0.filename + 1;
      local_1d0.line = 0x8d7;
      local_1d0.funcname = "CfdAddPsbtRecord";
      cfd::core::logger::warn<int&>(&local_1d0,"type is invalid: {}",&local_1c);
      uVar2 = __cxa_allocate_exception(0x30);
      message = (string *)local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1f1 + 1),"Failed to parameter. type is invalid.",
                 (allocator *)message);
      cfd::core::CfdException::CfdException(local_30,local_1c,message);
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Psbt::SetTxOutRecord
              (*(Psbt **)(local_78 + 0x18),local_20,&local_150,(ByteData *)&stack0xfffffffffffffe70)
    ;
  }
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x5ff28a);
  cfd::core::ByteData::~ByteData((ByteData *)0x5ff297);
  return local_4;
}

Assistant:

int CfdAddPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index, const char* key,
    const char* value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (value == nullptr) {
      warn(CFD_LOG_SOURCE, "value is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    ByteData data(value);
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        psbt_obj->psbt->SetGlobalRecord(key_data, data);
        break;
      case kCfdPsbtRecordTypeInput:
        psbt_obj->psbt->SetTxInRecord(index, key_data, data);
        break;
      case kCfdPsbtRecordTypeOutput:
        psbt_obj->psbt->SetTxOutRecord(index, key_data, data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}